

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.cpp
# Opt level: O3

string * __thiscall
jbcoin::rpcErrorString_abi_cxx11_(string *__return_storage_ptr__,jbcoin *this,Value *jv)

{
  size_type *psVar1;
  Value *pVVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  string local_50;
  string local_30;
  
  if (this[8] != (jbcoin)0x7) {
LAB_001a40f1:
    __assert_fail("RPC::contains_error(jv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/ErrorCodes.cpp"
                  ,0xba,"std::string jbcoin::rpcErrorString(const Json::Value &)");
  }
  pVVar2 = Json::Value::operator[]((Value *)this,"error");
  if (pVVar2 == (Value *)Json::Value::null) goto LAB_001a40f1;
  pVVar2 = Json::Value::operator[]((Value *)this,"error");
  Json::Value::asString_abi_cxx11_(&local_30,pVVar2);
  pVVar2 = Json::Value::operator[]((Value *)this,"error_message");
  Json::Value::asString_abi_cxx11_(&local_50,pVVar2);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    uVar4 = local_30.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar4 < local_50._M_string_length + local_30._M_string_length) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar4 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_30._M_string_length <= (ulong)uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_30._M_dataplus._M_p);
      goto LAB_001a4073;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_30,(ulong)local_50._M_dataplus._M_p);
LAB_001a4073:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

bool contains_error (Json::Value const& json)
{
    if (json.isObject() && json.isMember (jss::error))
        return true;
    return false;
}